

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sign.c
# Opt level: O1

_Bool COSE_Sign_SetContent(HCOSE_SIGN h,byte *rgb,size_t cb,cose_errback *perr)

{
  _Bool _Var1;
  _Bool _Var2;
  cose_error cVar3;
  cn_cbor *cb_value;
  cn_cbor *cb_00;
  
  if ((h == (HCOSE_SIGN)0x0) || (_Var1 = _COSE_IsInList(SignRoot,(COSE *)h), !_Var1)) {
    cVar3 = COSE_ERR_INVALID_HANDLE;
LAB_0019d798:
    cb_00 = (cn_cbor *)0x0;
    if (perr == (cose_errback *)0x0) {
      _Var1 = false;
      goto LAB_0019d7ae;
    }
    cb_value = (cn_cbor *)0x0;
LAB_0019d7a3:
    perr->err = cVar3;
    cb_00 = cb_value;
  }
  else {
    if (rgb == (byte *)0x0) {
      cVar3 = COSE_ERR_INVALID_PARAMETER;
      goto LAB_0019d798;
    }
    cb_value = cn_cbor_data_create(rgb,(int)cb,(cn_cbor_errback *)0x0);
    if (cb_value == (cn_cbor *)0x0) {
      cVar3 = COSE_ERR_OUT_OF_MEMORY;
      goto LAB_0019d798;
    }
    cb_00 = (cn_cbor *)0x0;
    _Var2 = _COSE_array_replace((COSE *)h,cb_value,2,(cn_cbor_errback *)0x0);
    _Var1 = true;
    if (_Var2) goto LAB_0019d7ae;
    cVar3 = COSE_ERR_OUT_OF_MEMORY;
    cb_00 = cb_value;
    if (perr != (cose_errback *)0x0) goto LAB_0019d7a3;
  }
  _Var1 = false;
LAB_0019d7ae:
  if (cb_00 != (cn_cbor *)0x0) {
    cn_cbor_free(cb_00);
  }
  return _Var1;
}

Assistant:

bool COSE_Sign_SetContent(HCOSE_SIGN h, const byte * rgb, size_t cb, cose_errback * perr)
{
#ifdef USE_CBOR_CONTEXT
	cn_cbor_context * context = NULL;
#endif
	cn_cbor * p = NULL;
	COSE_SignMessage * pMessage = (COSE_SignMessage *)h;
	bool f = false;

	CHECK_CONDITION(IsValidSignHandle(h), COSE_ERR_INVALID_HANDLE);
	CHECK_CONDITION(rgb != NULL, COSE_ERR_INVALID_PARAMETER);

#ifdef USE_CBOR_CONTEXT
	context = &pMessage->m_message.m_allocContext;
#endif

	p = cn_cbor_data_create(rgb, (int) cb, CBOR_CONTEXT_PARAM_COMMA NULL);
	CHECK_CONDITION(p != NULL, COSE_ERR_OUT_OF_MEMORY);

	CHECK_CONDITION(_COSE_array_replace(&pMessage->m_message, p, INDEX_BODY, CBOR_CONTEXT_PARAM_COMMA NULL), COSE_ERR_OUT_OF_MEMORY);
	p = NULL;

	f = true;
errorReturn:
	if (p != NULL) CN_CBOR_FREE(p, context);

	return f;
}